

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_encrypt.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte *pbVar1;
  int ret;
  size_t sVar2;
  FILE *__stream;
  char *pcVar3;
  ulong uVar4;
  size_t olen;
  mbedtls_pk_context pk;
  mbedtls_ctr_drbg_context ctr_drbg;
  uchar buf [512];
  mbedtls_entropy_context entropy;
  uchar input [1024];
  
  olen = 0;
  mbedtls_ctr_drbg_init(&ctr_drbg);
  if (argc == 3) {
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    mbedtls_entropy_init(&entropy);
    ret = mbedtls_ctr_drbg_seed
                    (&ctr_drbg,mbedtls_entropy_func,&entropy,(uchar *)"mbedtls_pk_encrypt",0x12);
    if (ret == 0) {
      printf("\n  . Reading public key from \'%s\'",argv[1]);
      fflush(_stdout);
      mbedtls_pk_init(&pk);
      ret = mbedtls_pk_parse_public_keyfile(&pk,argv[1]);
      if (ret == 0) {
        pcVar3 = argv[2];
        sVar2 = strlen(pcVar3);
        if (100 < sVar2) {
          puts(" Input data larger than 100 characters.\n");
          ret = 0;
          goto LAB_0010a3d6;
        }
        memcpy(input,pcVar3,sVar2);
        printf("\n  . Generating the encrypted value");
        fflush(_stdout);
        sVar2 = strlen(argv[2]);
        ret = mbedtls_pk_encrypt(&pk,input,sVar2,buf,&olen,0x200,mbedtls_ctr_drbg_random,&ctr_drbg);
        if (ret == 0) {
          __stream = fopen("result-enc.txt","wb+");
          if (__stream != (FILE *)0x0) {
            uVar4 = 0;
            while (uVar4 < olen) {
              pbVar1 = buf + uVar4;
              uVar4 = uVar4 + 1;
              pcVar3 = " ";
              if ((uVar4 & 0xf) == 0) {
                pcVar3 = "\r\n";
              }
              fprintf(__stream,"%02X%s",(ulong)*pbVar1,pcVar3);
            }
            fclose(__stream);
            ret = 0;
            printf("\n  . Done (created \"%s\")\n\n","result-enc.txt");
            goto LAB_0010a3d6;
          }
          printf(" failed\n  ! Could not create %s\n\n","result-enc.txt");
          goto LAB_0010a385;
        }
        uVar4 = (ulong)(uint)-ret;
        pcVar3 = " failed\n  ! mbedtls_pk_encrypt returned -0x%04x\n";
      }
      else {
        uVar4 = (ulong)(uint)-ret;
        pcVar3 = " failed\n  ! mbedtls_pk_parse_public_keyfile returned -0x%04x\n";
      }
    }
    else {
      uVar4 = (ulong)(uint)-ret;
      pcVar3 = " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n";
    }
    printf(pcVar3,uVar4);
  }
  else {
    puts("usage: mbedtls_pk_encrypt <key_file> <string of max 100 characters>");
LAB_0010a385:
    ret = 1;
  }
LAB_0010a3d6:
  mbedtls_ctr_drbg_free(&ctr_drbg);
  mbedtls_entropy_free(&entropy);
  if (ret != 0) {
    mbedtls_strerror(ret,(char *)buf,0x200);
    printf("  !  Last error was: %s\n",buf);
  }
  return ret;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret;
    size_t i, olen = 0;
    mbedtls_pk_context pk;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char input[1024];
    unsigned char buf[512];
    const char *pers = "mbedtls_pk_encrypt";

    ret = 1;
    mbedtls_ctr_drbg_init( &ctr_drbg );

    if( argc != 3 )
    {
        mbedtls_printf( "usage: mbedtls_pk_encrypt <key_file> <string of max 100 characters>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n", -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from '%s'", argv[1] );
    fflush( stdout );

    mbedtls_pk_init( &pk );

    if( ( ret = mbedtls_pk_parse_public_keyfile( &pk, argv[1] ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_parse_public_keyfile returned -0x%04x\n", -ret );
        goto exit;
    }

    if( strlen( argv[2] ) > 100 )
    {
        mbedtls_printf( " Input data larger than 100 characters.\n\n" );
        goto exit;
    }

    memcpy( input, argv[2], strlen( argv[2] ) );

    /*
     * Calculate the RSA encryption of the hash.
     */
    mbedtls_printf( "\n  . Generating the encrypted value" );
    fflush( stdout );

    if( ( ret = mbedtls_pk_encrypt( &pk, input, strlen( argv[2] ),
                            buf, &olen, sizeof(buf),
                            mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_encrypt returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Write the signature into result-enc.txt
     */
    if( ( f = fopen( "result-enc.txt", "wb+" ) ) == NULL )
    {
        ret = 1;
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", "result-enc.txt" );
        goto exit;
    }

    for( i = 0; i < olen; i++ )
        mbedtls_fprintf( f, "%02X%s", buf[i],
                 ( i + 1 ) % 16 == 0 ? "\r\n" : " " );

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", "result-enc.txt" );

exit:
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(MBEDTLS_ERROR_C)
    if( ret != 0 )
    {
        mbedtls_strerror( ret, (char *) buf, sizeof(buf) );
        mbedtls_printf( "  !  Last error was: %s\n", buf );
    }
#endif

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( ret );
}